

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

void amqpvalue_destroy(AMQP_VALUE value)

{
  uint32_t *puVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if (value == (AMQP_VALUE)0x0) {
    return;
  }
  puVar1 = &value[-1].value.binary_value.length;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  switch(value->type) {
  case AMQP_TYPE_BINARY:
  case AMQP_TYPE_STRING:
  case AMQP_TYPE_SYMBOL:
    pvVar2 = (value->value).binary_value.bytes;
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
    }
    goto switchD_00105685_default;
  case AMQP_TYPE_LIST:
    pvVar2 = (value->value).binary_value.bytes;
    if (pvVar2 == (void *)0x0) goto switchD_00105685_default;
    if ((value->value).binary_value.length != 0) {
      uVar4 = 0;
      do {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value->value).described_value.descriptor)->type + uVar4 * 2));
        uVar4 = uVar4 + 1;
      } while (uVar4 < (value->value).binary_value.length);
LAB_00105754:
      pvVar2 = (value->value).binary_value.bytes;
    }
    break;
  case AMQP_TYPE_MAP:
    pvVar2 = (value->value).binary_value.bytes;
    if (pvVar2 == (void *)0x0) goto switchD_00105685_default;
    if ((value->value).binary_value.length != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           ((long)&((value->value).described_value.descriptor)->type + lVar3));
        amqpvalue_destroy(*(AMQP_VALUE *)
                           ((long)&((value->value).described_value.descriptor)->value + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < (value->value).binary_value.length);
      goto LAB_00105754;
    }
    break;
  case AMQP_TYPE_ARRAY:
    pvVar2 = (value->value).binary_value.bytes;
    if (pvVar2 == (void *)0x0) goto switchD_00105685_default;
    if ((value->value).binary_value.length != 0) {
      uVar4 = 0;
      do {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value->value).described_value.descriptor)->type + uVar4 * 2));
        uVar4 = uVar4 + 1;
      } while (uVar4 < (value->value).binary_value.length);
      goto LAB_00105754;
    }
    break;
  case AMQP_TYPE_DESCRIBED:
  case AMQP_TYPE_COMPOSITE:
    amqpvalue_destroy((value->value).described_value.descriptor);
    amqpvalue_destroy((value->value).described_value.value);
  default:
    goto switchD_00105685_default;
  }
  free(pvVar2);
  (value->value).described_value.descriptor = (AMQP_VALUE)0x0;
switchD_00105685_default:
  value->type = AMQP_TYPE_UNKNOWN;
  free((void *)((long)&value[-1].value + 8));
  return;
}

Assistant:

void amqpvalue_destroy(AMQP_VALUE value)
{
    /* Codes_SRS_AMQPVALUE_01_315: [If the value argument is NULL, amqpvalue_destroy shall do nothing.] */
    if (value != NULL)
    {
        if (DEC_REF(AMQP_VALUE_DATA, value) == DEC_RETURN_ZERO)
        {
            /* Codes_SRS_AMQPVALUE_01_314: [amqpvalue_destroy shall free all resources allocated by any of the amqpvalue_create_xxx functions or amqpvalue_clone.] */
            AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
            amqpvalue_clear(value_data);
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, value);
        }
    }
}